

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_stateless_kernel_1.h
# Opt level: O1

void __thiscall
dlib::
memory_manager_stateless_kernel_1<dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node>
::deallocate(memory_manager_stateless_kernel_1<dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node>
             *this,node *item)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  
  if (item != (node *)0x0) {
    paVar2 = &item->item[0x13].state.full_name.field_2;
    lVar3 = -0x500;
    do {
      pcVar1 = (((string *)(paVar2 + -1))->_M_dataplus)._M_p;
      if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar1) {
        operator_delete(pcVar1);
      }
      if (paVar2 + -2 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)paVar2[-3]._M_allocated_capacity) {
        operator_delete((void *)paVar2[-3]._M_allocated_capacity);
      }
      paVar2 = paVar2 + -4;
      lVar3 = lVar3 + 0x40;
    } while (lVar3 != 0);
    operator_delete(item);
    return;
  }
  return;
}

Assistant:

void deallocate (
                T* item
            )
            {
                delete item;
            }